

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O0

void __thiscall
ModelFlattening_resolveFlattenMissingModel_Test::TestBody
          (ModelFlattening_resolveFlattenMissingModel_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  char *pcVar3;
  AssertHelper local_200 [8];
  Message local_1f8 [8];
  shared_ptr<libcellml::Issue> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_2;
  Message local_1a8 [8];
  unsigned_long local_1a0 [2];
  undefined1 local_190 [8];
  AssertionResult gtest_ar_1;
  ModelPtr flatModel;
  string local_168 [32];
  shared_ptr<libcellml::Model> local_148;
  AssertHelper local_138 [8];
  Message local_130 [8];
  unsigned_long local_128 [2];
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  string local_100 [32];
  string local_e0 [32];
  undefined1 local_c0 [8];
  ImporterPtr importer;
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [8];
  ModelPtr originalModel;
  ParserPtr parser;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string expectedError;
  ModelFlattening_resolveFlattenMissingModel_Test *this_local;
  
  expectedError.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,
             "Component \'left\' requires a model imported from \'diamond_point.cellml\' which is not available in the importer."
             ,&local_31);
  std::allocator<char>::~allocator(&local_31);
  this_00 = &originalModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  libcellml::Parser::create(SUB81(this_00,0));
  std::__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"importer/diamond.cellml",
             (allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  fileContents(local_88);
  libcellml::Parser::parseModel((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Importer::create
            (SUB81((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)local_c0,0));
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"importer/",(allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  resourcePath(local_e0);
  libcellml::Importer::resolveImports((shared_ptr *)peVar2,(string *)local_68);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  local_128[1] = 0;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c0);
  local_128[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_118,"size_t(0)","importer->issueCount()",local_128 + 1,
             local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x3bd,pcVar3);
    testing::internal::AssertHelper::operator=(local_138,local_130);
    testing::internal::AssertHelper::~AssertHelper(local_138);
    testing::Message::~Message(local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  peVar2 = std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_c0);
  std::shared_ptr<libcellml::Model>::shared_ptr(&local_148,(nullptr_t)0x0);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c0);
  libcellml::Importer::key_abi_cxx11_((ulong *)local_168);
  libcellml::Importer::replaceModel((shared_ptr *)peVar2,(string *)&local_148);
  std::__cxx11::string::~string(local_168);
  std::shared_ptr<libcellml::Model>::~shared_ptr(&local_148);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c0);
  libcellml::Importer::flattenModel((shared_ptr *)&gtest_ar_1.message_);
  local_1a0[1] = 1;
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c0);
  local_1a0[0] = libcellml::Logger::issueCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_190,"size_t(1)","importer->issueCount()",local_1a0 + 1,
             local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_190);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x3c4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  std::__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_c0);
  libcellml::Logger::issue((ulong)&local_1f0);
  std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &local_1f0);
  libcellml::Issue::description_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1c0,"expectedError","importer->issue(0)->description()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             &local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::shared_ptr<libcellml::Issue>::~shared_ptr(&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x3c5,pcVar3);
    testing::internal::AssertHelper::operator=(local_200,local_1f8);
    testing::internal::AssertHelper::~AssertHelper(local_200);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_1.message_);
  std::shared_ptr<libcellml::Importer>::~shared_ptr((shared_ptr<libcellml::Importer> *)local_c0);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_68);
  std::shared_ptr<libcellml::Parser>::~shared_ptr
            ((shared_ptr<libcellml::Parser> *)
             &originalModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ModelFlattening, resolveFlattenMissingModel)
{
    const std::string expectedError = "Component 'left' requires a model imported from 'diamond_point.cellml' which is not available in the importer.";
    auto parser = libcellml::Parser::create();
    auto originalModel = parser->parseModel(fileContents("importer/diamond.cellml"));
    auto importer = libcellml::Importer::create();

    // Resolve imports.
    importer->resolveImports(originalModel, resourcePath("importer/"));
    EXPECT_EQ(size_t(0), importer->issueCount());

    // Corrupt the importer library by removing a model that's required.
    importer->replaceModel(nullptr, importer->key(1));

    // Attempt to flatten the model.
    auto flatModel = importer->flattenModel(originalModel);
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(expectedError, importer->issue(0)->description());
}